

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

bool is_repeat(Node *test)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  bool bVar2;
  long lVar3;
  long lVar4;
  allocator local_51;
  string board_hash;
  
  std::__cxx11::string::string((string *)&board_hash,"",&local_51);
  for (lVar4 = 2; lVar4 != 10; lVar4 = lVar4 + 1) {
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      std::__cxx11::string::push_back((char)&board_hash);
    }
  }
  if (board_hash._M_string_length != 0) {
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (prev_moves_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       prev_moves_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&board_hash);
    bVar2 = true;
    if (_Var1._M_current !=
        prev_moves_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00104278;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&prev_moves_abi_cxx11_,&board_hash);
  bVar2 = false;
LAB_00104278:
  std::__cxx11::string::~string((string *)&board_hash);
  return bVar2;
}

Assistant:

bool is_repeat(Node& test){

    string board_hash = "";
    char c;
    int i, j;

    for(i=2; i<10; i++){
        for(j=2; j<10; j++){
            c = test->board[i][j];
            if(' ' != c)
                board_hash += c;
            else
                board_hash += '0';
        }
    }

    if(0 == board_hash.size() || find(prev_moves.begin(), prev_moves.end(), board_hash) == prev_moves.end()){
        prev_moves.push_back(board_hash);
        // cout << "NEW HASH :: " << board_hash << endl;
        return false;
    }
    // cout << "OLD HASH :: " << board_hash << endl;
    return true;
}